

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint32_t __thiscall
booster::locale::util::base_converter::from_unicode
          (base_converter *this,uint32_t u,char *begin,char *end)

{
  char *end_local;
  char *begin_local;
  uint32_t u_local;
  base_converter *this_local;
  undefined4 local_4;
  
  if (begin == end) {
    local_4 = 0xfffffffe;
  }
  else if (u < 0x80) {
    *begin = (char)u;
    local_4 = 1;
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

virtual uint32_t from_unicode(uint32_t u,char *begin,char const *end) 
        {
            if(begin==end)
                return incomplete;
            if(u >= 0x80)
                return illegal;
            *begin = static_cast<char>(u);
            return 1;
        }